

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushTextWrapPos(float wrap_pos_x)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *ctx;
  float *__dest;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  (pIVar3->DC).TextWrapPos = wrap_pos_x;
  iVar6 = (pIVar3->DC).TextWrapPosStack.Size;
  if (iVar6 == (pIVar3->DC).TextWrapPosStack.Capacity) {
    if (iVar6 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar6 / 2 + iVar6;
    }
    iVar8 = iVar6 + 1;
    if (iVar6 + 1 < iVar7) {
      iVar8 = iVar7;
    }
    piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    pfVar4 = (pIVar3->DC).TextWrapPosStack.Data;
    if (pfVar4 != (float *)0x0) {
      memcpy(__dest,pfVar4,(long)(pIVar3->DC).TextWrapPosStack.Size << 2);
      pfVar4 = (pIVar3->DC).TextWrapPosStack.Data;
      if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).TextWrapPosStack.Data = __dest;
    (pIVar3->DC).TextWrapPosStack.Capacity = iVar8;
    iVar6 = (pIVar3->DC).TextWrapPosStack.Size;
  }
  else {
    __dest = (pIVar3->DC).TextWrapPosStack.Data;
  }
  __dest[iVar6] = wrap_pos_x;
  pIVar2 = &(pIVar3->DC).TextWrapPosStack;
  pIVar2->Size = pIVar2->Size + 1;
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}